

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utilities.cpp
# Opt level: O2

int celero::Random(void)

{
  result_type_conflict1 rVar1;
  uint uVar2;
  int iVar3;
  
  if (Random()::rd == '\0') {
    iVar3 = __cxa_guard_acquire(&Random()::rd);
    if (iVar3 != 0) {
      std::random_device::random_device(&Random::rd);
      __cxa_atexit(std::random_device::~random_device,&Random::rd,&__dso_handle);
      __cxa_guard_release(&Random()::rd);
    }
  }
  if (Random()::gen == '\0') {
    iVar3 = __cxa_guard_acquire(&Random()::gen);
    if (iVar3 != 0) {
      uVar2 = std::random_device::_M_getval();
      std::
      mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
      ::seed(&Random::gen,(ulong)uVar2);
      __cxa_guard_release(&Random()::gen);
    }
  }
  if (Random()::dis == '\0') {
    iVar3 = __cxa_guard_acquire(&Random()::dis);
    if (iVar3 != 0) {
      Random::dis._M_param._M_a = -0x80000000;
      Random::dis._M_param._M_b = 0x7fffffff;
      __cxa_guard_release(&Random()::dis);
    }
  }
  rVar1 = std::uniform_int_distribution<int>::operator()(&Random::dis,&Random::gen);
  return rVar1;
}

Assistant:

int celero::Random()
{
	// http://en.cppreference.com/w/cpp/numeric/random/uniform_int_distribution

	// Will be used to obtain a seed for the random number engine
	static std::random_device rd;

	// Standard mersenne_twister_engine seeded with rd()
	static std::mt19937 gen(rd());

	static std::uniform_int_distribution<> dis(std::numeric_limits<int>::lowest(), std::numeric_limits<int>::max());

	return dis(gen);
}